

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubFodderBuilders.cpp
# Opt level: O2

void __thiscall SubFodderBuilderB::addIngredientA(SubFodderBuilderB *this)

{
  Fodder *this_00;
  string local_40;
  allocator local_19;
  
  this_00 = this->_fodder;
  std::__cxx11::string::string((string *)&local_40,"BA",&local_19);
  Fodder::setIngredientA(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void SubFodderBuilderB::addIngredientA() {
	// add something
	_fodder->setIngredientA("BA");
}